

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_gc2gc(HTS_Vocoder *v,double *c1,int m1,double g1,double *c2,int m2,double g2)

{
  int iVar1;
  double *ptr;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  size_t num;
  double dVar9;
  double dVar10;
  
  uVar5 = (ulong)m1;
  ptr = v->gc2gc_buff;
  if (v->gc2gc_size < uVar5) {
    if (ptr != (double *)0x0) {
      HTS_free(ptr);
    }
    num = (size_t)(m1 + 1);
    ptr = (double *)HTS_calloc(num,8);
    v->gc2gc_buff = ptr;
    v->gc2gc_size = uVar5;
  }
  else {
    num = (size_t)(m1 + 1);
  }
  if (ptr < c1) {
    if (m1 != -1) {
      sVar2 = 0;
      do {
        ptr[sVar2] = c1[sVar2];
        sVar2 = sVar2 + 1;
      } while (num != sVar2);
    }
  }
  else if (m1 != -1) {
    do {
      ptr[num - 1] = c1[num - 1];
      num = num - 1;
    } while (num != 0);
  }
  *c2 = *ptr;
  if (0 < m2) {
    uVar3 = 1;
    lVar4 = 0;
    do {
      iVar1 = (int)uVar3;
      iVar6 = iVar1 + -1;
      if ((long)uVar5 < (long)uVar3) {
        iVar6 = m1;
      }
      if (iVar6 < 1) {
        dVar9 = 0.0;
        dVar10 = 0.0;
      }
      else {
        dVar9 = 0.0;
        dVar10 = 0.0;
        uVar7 = 1;
        lVar8 = lVar4;
        do {
          dVar9 = dVar9 + ptr[uVar7] * c2[lVar8] * (double)(int)lVar8;
          dVar10 = dVar10 + ptr[uVar7] * c2[lVar8] * (double)(int)uVar7;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (iVar6 + 1 != uVar7);
      }
      if ((long)uVar5 < (long)uVar3) {
        dVar9 = (dVar10 * g2 - dVar9 * g1) / (double)iVar1;
      }
      else {
        dVar9 = (dVar10 * g2 - dVar9 * g1) / (double)iVar1 + ptr[uVar3];
      }
      c2[uVar3] = dVar9;
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 1;
    } while (uVar3 != m2 + 1);
  }
  return;
}

Assistant:

static void HTS_gc2gc(HTS_Vocoder * v, double *c1, const int m1, const double g1, double *c2, const int m2, const double g2)
{
   int i, min, k, mk;
   double ss1, ss2, cc;

   if (m1 > v->gc2gc_size) {
      if (v->gc2gc_buff != NULL)
         HTS_free(v->gc2gc_buff);
      v->gc2gc_buff = (double *) HTS_calloc(m1 + 1, sizeof(double));
      v->gc2gc_size = m1;
   }

   HTS_movem(c1, v->gc2gc_buff, m1 + 1);

   c2[0] = v->gc2gc_buff[0];
   for (i = 1; i <= m2; i++) {
      ss1 = ss2 = 0.0;
      min = m1 < i ? m1 : i - 1;
      for (k = 1; k <= min; k++) {
         mk = i - k;
         cc = v->gc2gc_buff[k] * c2[mk];
         ss2 += k * cc;
         ss1 += mk * cc;
      }

      if (i <= m1)
         c2[i] = v->gc2gc_buff[i] + (g2 * ss2 - g1 * ss1) / i;
      else
         c2[i] = (g2 * ss2 - g1 * ss1) / i;
   }
}